

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int getAutoVacuum(char *z)

{
  long lVar1;
  uint in_EAX;
  uint uVar2;
  long lVar3;
  byte *pbVar4;
  ulong uVar5;
  char *pcVar6;
  byte bVar7;
  uchar uVar8;
  byte *pbVar9;
  uchar uVar10;
  byte bVar11;
  int x;
  undefined8 uStack_18;
  
  bVar7 = *z;
  pcVar6 = "incremental";
  if (bVar7 != 0) {
    lVar1 = 0;
    bVar11 = bVar7;
    do {
      lVar3 = lVar1;
      uVar8 = ""[bVar11];
      uVar10 = ""[(byte)"unix-none"[lVar3 + 5]];
      if (uVar8 != uVar10) goto LAB_0019e224;
      bVar11 = z[lVar3 + 1];
      lVar1 = lVar3 + 1;
    } while (bVar11 != 0);
    uVar10 = ""[(byte)"unix-none"[lVar3 + 6]];
    uVar8 = '\0';
LAB_0019e224:
    if (uVar8 == uVar10) {
      return 0;
    }
    pbVar9 = (byte *)(z + 1);
    pbVar4 = (byte *)0x1ae6e8;
    bVar11 = bVar7;
    do {
      uVar5 = (ulong)bVar11;
      if (""[bVar11] != ""[*pbVar4]) break;
      pbVar4 = pbVar4 + 1;
      bVar11 = *pbVar9;
      pbVar9 = pbVar9 + 1;
      uVar5 = 0;
    } while (bVar11 != 0);
    if (""[uVar5] == ""[*pbVar4]) {
      return 1;
    }
    if (bVar7 != 0) {
      pbVar9 = (byte *)(z + 1);
      pcVar6 = "incremental";
      do {
        uVar5 = (ulong)bVar7;
        if (""[bVar7] != ""[(byte)*pcVar6]) break;
        pcVar6 = (char *)((byte *)pcVar6 + 1);
        bVar7 = *pbVar9;
        pbVar9 = pbVar9 + 1;
        uVar5 = 0;
      } while (bVar7 != 0);
      goto LAB_0019e2ad;
    }
  }
  uVar5 = 0;
LAB_0019e2ad:
  uVar2 = 2;
  if (""[uVar5] != ""[(byte)*pcVar6]) {
    uStack_18 = (ulong)in_EAX;
    sqlite3GetInt32(z,(int *)((long)&uStack_18 + 4));
    uVar2 = uStack_18._4_4_ & 0xff;
    if (2 < uStack_18._4_4_) {
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

SQLITE_API int sqlite3_stricmp(const char *zLeft, const char *zRight){
  register unsigned char *a, *b;
  a = (unsigned char *)zLeft;
  b = (unsigned char *)zRight;
  while( *a!=0 && UpperToLower[*a]==UpperToLower[*b]){ a++; b++; }
  return UpperToLower[*a] - UpperToLower[*b];
}